

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_METAL_attribute
               (Context *ctx,RegisterType regtype,int regnum,MOJOSHADER_usage usage,int index,
               int wmask,int flags)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  MiscTypeType mt;
  int skipreference;
  char var [64];
  char index_str [16];
  char *usage_str;
  uint local_20;
  int wmask_local;
  int index_local;
  MOJOSHADER_usage usage_local;
  int regnum_local;
  RegisterType regtype_local;
  Context *ctx_local;
  
  memset(var + 0x38,0,0x10);
  get_METAL_varname_in_buf(ctx,regtype,regnum,(char *)&mt,0x40);
  if (index != 0) {
    snprintf(var + 0x38,0x10,"%u",(ulong)(uint)index);
  }
  iVar1 = shader_is_vertex(ctx);
  if (iVar1 == 0) {
    iVar1 = shader_is_pixel(ctx);
    if (iVar1 == 0) {
      fail(ctx,"Unknown shader type");
    }
    else if ((flags & 4U) == 0) {
      if ((regtype == REG_TYPE_COLOROUT) || (regtype == REG_TYPE_DEPTHOUT)) {
        push_output(ctx,&ctx->outputs);
        sVar2 = buffer_size(ctx->outputs);
        if (sVar2 == 0) {
          output_line(ctx,"struct %s_Output",ctx->mainfn);
          output_line(ctx,"{");
        }
        ctx->indent = ctx->indent + 1;
        if (regtype == REG_TYPE_COLOROUT) {
          output_line(ctx,"float4 %s [[color(%d)]];",&mt,(ulong)(uint)regnum);
        }
        else if (regtype == REG_TYPE_DEPTHOUT) {
          output_line(ctx,"float %s [[depth(any)]];",&mt);
        }
        pop_output(ctx);
        push_output(ctx,&ctx->mainline_top);
        ctx->indent = ctx->indent + 1;
        output_line(ctx,"#define %s output.%s",&mt,&mt);
        pop_output(ctx);
        push_output(ctx,&ctx->mainline);
        ctx->indent = ctx->indent + 1;
        output_line(ctx,"#undef %s",&mt);
        pop_output(ctx);
      }
      else if (((regtype == REG_TYPE_ADDRESS) || (regtype == REG_TYPE_INPUT)) ||
              (regtype == REG_TYPE_MISCTYPE)) {
        bVar3 = false;
        push_output(ctx,&ctx->inputs);
        sVar2 = buffer_size(ctx->inputs);
        if (sVar2 == 0) {
          output_line(ctx,"struct %s_Input",ctx->mainfn);
          output_line(ctx,"{");
        }
        ctx->indent = ctx->indent + 1;
        if (regtype == REG_TYPE_MISCTYPE) {
          if (regnum == 1) {
            output_line(ctx,"bool %s [[front_facing]];",&mt);
          }
          else if (regnum == 0) {
            output_line(ctx,"float4 %s [[position]];",&mt);
          }
          else {
            fail(ctx,"BUG: unhandled misc register");
          }
        }
        else if (usage == MOJOSHADER_USAGE_TEXCOORD) {
          iVar1 = shader_version_atleast(ctx,'\x01','\x04');
          bVar3 = iVar1 == 0;
          output_line(ctx,"float4 %s [[user(texcoord%d)]];",&mt,(ulong)(uint)index);
        }
        else if (usage == MOJOSHADER_USAGE_COLOR) {
          output_line(ctx,"float4 %s [[user(color%d)]];",&mt,(ulong)(uint)index);
        }
        else if (usage == MOJOSHADER_USAGE_FOG) {
          output_line(ctx,"float4 %s [[user(fog)]];",&mt);
        }
        pop_output(ctx);
        if (!bVar3) {
          push_output(ctx,&ctx->mainline_top);
          ctx->indent = ctx->indent + 1;
          output_line(ctx,"#define %s input.%s",&mt,&mt);
          pop_output(ctx);
          push_output(ctx,&ctx->mainline);
          ctx->indent = ctx->indent + 1;
          output_line(ctx,"#undef %s",&mt);
          pop_output(ctx);
        }
      }
      else {
        fail(ctx,"unknown pixel shader attribute register");
      }
    }
    else {
      failf(ctx,"centroid unsupported in %s profile",ctx->profile->name);
    }
  }
  else {
    iVar1 = shader_version_atleast(ctx,'\x03','\0');
    local_20 = index;
    wmask_local = usage;
    usage_local = regtype;
    if (iVar1 == 0) {
      local_20 = regnum;
      if (regtype == REG_TYPE_RASTOUT) {
        usage_local = MOJOSHADER_USAGE_TANGENT;
        if (regnum == 0) {
          wmask_local = 0;
        }
        else if (regnum == 1) {
          wmask_local = 0xb;
        }
        else if (regnum == 2) {
          wmask_local = 4;
        }
      }
      else if (regtype == REG_TYPE_ATTROUT) {
        usage_local = MOJOSHADER_USAGE_TANGENT;
        wmask_local = 10;
      }
      else {
        local_20 = index;
        if (regtype == REG_TYPE_OUTPUT) {
          usage_local = MOJOSHADER_USAGE_TANGENT;
          wmask_local = 5;
          local_20 = regnum;
        }
      }
    }
    if (usage_local == MOJOSHADER_USAGE_BLENDWEIGHT) {
      push_output(ctx,&ctx->inputs);
      sVar2 = buffer_size(ctx->inputs);
      if (sVar2 == 0) {
        output_line(ctx,"struct %s_Input",ctx->mainfn);
        output_line(ctx,"{");
      }
      ctx->indent = ctx->indent + 1;
      output_line(ctx,"float4 %s [[attribute(%d)]];",&mt,(ulong)(uint)regnum);
      pop_output(ctx);
      push_output(ctx,&ctx->mainline_top);
      ctx->indent = ctx->indent + 1;
      output_line(ctx,"#define %s input.%s",&mt,&mt);
      pop_output(ctx);
      push_output(ctx,&ctx->mainline);
      ctx->indent = ctx->indent + 1;
      output_line(ctx,"#undef %s",&mt);
      pop_output(ctx);
    }
    else if (usage_local == MOJOSHADER_USAGE_TANGENT) {
      push_output(ctx,&ctx->outputs);
      sVar2 = buffer_size(ctx->outputs);
      if (sVar2 == 0) {
        output_line(ctx,"struct %s_Output",ctx->mainfn);
        output_line(ctx,"{");
      }
      ctx->indent = ctx->indent + 1;
      switch(wmask_local) {
      case 0:
        output_line(ctx,"float4 %s [[position]];",&mt);
        break;
      default:
        break;
      case 4:
        output_line(ctx,"float4 %s [[point_size]];",&mt);
        break;
      case 5:
        output_line(ctx,"float4 %s [[user(texcoord%d)]];",&mt,(ulong)local_20);
        break;
      case 10:
        output_line(ctx,"float4 %s [[user(color%d)]];",&mt,(ulong)local_20);
        break;
      case 0xb:
        output_line(ctx,"float4 %s [[user(fog)]];",&mt);
      }
      pop_output(ctx);
      push_output(ctx,&ctx->mainline_top);
      ctx->indent = ctx->indent + 1;
      output_line(ctx,"#define %s output.%s",&mt,&mt);
      pop_output(ctx);
      push_output(ctx,&ctx->mainline);
      ctx->indent = ctx->indent + 1;
      output_line(ctx,"#undef %s",&mt);
      pop_output(ctx);
    }
    else {
      fail(ctx,"unknown vertex shader attribute register");
    }
  }
  return;
}

Assistant:

static void emit_METAL_attribute(Context *ctx, RegisterType regtype, int regnum,
                                MOJOSHADER_usage usage, int index, int wmask,
                                int flags)
{
    // !!! FIXME: this function doesn't deal with write masks at all yet!
    const char *usage_str = NULL;
    char index_str[16] = { '\0' };
    char var[64];

    get_METAL_varname_in_buf(ctx, regtype, regnum, var, sizeof (var));

    //assert((flags & MOD_PP) == 0);  // !!! FIXME: is PP allowed?

    if (index != 0)  // !!! FIXME: a lot of these MUST be zero.
        snprintf(index_str, sizeof (index_str), "%u", (uint) index);

    if (shader_is_vertex(ctx))
    {
        // pre-vs3 output registers.
        // these don't ever happen in DCL opcodes, I think. Map to vs_3_*
        //  output registers.
        if (!shader_version_atleast(ctx, 3, 0))
        {
            if (regtype == REG_TYPE_RASTOUT)
            {
                regtype = REG_TYPE_OUTPUT;
                index = regnum;
                switch ((const RastOutType) regnum)
                {
                    case RASTOUT_TYPE_POSITION:
                        usage = MOJOSHADER_USAGE_POSITION;
                        break;
                    case RASTOUT_TYPE_FOG:
                        usage = MOJOSHADER_USAGE_FOG;
                        break;
                    case RASTOUT_TYPE_POINT_SIZE:
                        usage = MOJOSHADER_USAGE_POINTSIZE;
                        break;
                } // switch
            } // if

            else if (regtype == REG_TYPE_ATTROUT)
            {
                regtype = REG_TYPE_OUTPUT;
                usage = MOJOSHADER_USAGE_COLOR;
                index = regnum;
            } // else if

            else if (regtype == REG_TYPE_TEXCRDOUT)
            {
                regtype = REG_TYPE_OUTPUT;
                usage = MOJOSHADER_USAGE_TEXCOORD;
                index = regnum;
            } // else if
        } // if

        if (regtype == REG_TYPE_INPUT)
        {
            push_output(ctx, &ctx->inputs);
            if (buffer_size(ctx->inputs) == 0)
            {
                output_line(ctx, "struct %s_Input", ctx->mainfn);
                output_line(ctx, "{");
            } // if

            ctx->indent++;
            output_line(ctx, "float4 %s [[attribute(%d)]];", var, regnum);
            pop_output(ctx);

            push_output(ctx, &ctx->mainline_top);
            ctx->indent++;
            // !!! FIXME: might trigger unused var warnings in Clang.
            //output_line(ctx, "constant float4 &%s = input.%s;", var, var);
            output_line(ctx, "#define %s input.%s", var, var);
            pop_output(ctx);
            push_output(ctx, &ctx->mainline);
            ctx->indent++;
            output_line(ctx, "#undef %s", var);  // !!! FIXME: gross.
            pop_output(ctx);
        } // if

        else if (regtype == REG_TYPE_OUTPUT)
        {
            push_output(ctx, &ctx->outputs);
            if (buffer_size(ctx->outputs) == 0)
            {
                output_line(ctx, "struct %s_Output", ctx->mainfn);
                output_line(ctx, "{");
            } // if

            ctx->indent++;

            switch (usage)
            {
                case MOJOSHADER_USAGE_POSITION:
                    output_line(ctx, "float4 %s [[position]];", var);
                    break;
                case MOJOSHADER_USAGE_POINTSIZE:
                    output_line(ctx, "float4 %s [[point_size]];", var);
                    break;
                case MOJOSHADER_USAGE_COLOR:
                    output_line(ctx, "float4 %s [[user(color%d)]];", var, index);
                    break;
                case MOJOSHADER_USAGE_FOG:
                    output_line(ctx, "float4 %s [[user(fog)]];", var);
                    break;
                case MOJOSHADER_USAGE_TEXCOORD:
                    output_line(ctx, "float4 %s [[user(texcoord%d)]];", var, index);
                    break;
                default:
                    // !!! FIXME: we need to deal with some more built-in varyings here.
                    break;
            } // switch

            pop_output(ctx);

            push_output(ctx, &ctx->mainline_top);
            ctx->indent++;
            // !!! FIXME: this doesn't work.
            //output_line(ctx, "float4 &%s = output.%s;", var, var);
            output_line(ctx, "#define %s output.%s", var, var);
            pop_output(ctx);
            push_output(ctx, &ctx->mainline);
            ctx->indent++;
            output_line(ctx, "#undef %s", var);  // !!! FIXME: gross.
            pop_output(ctx);
        } // else if

        else
        {
            fail(ctx, "unknown vertex shader attribute register");
        } // else
    } // if

    else if (shader_is_pixel(ctx))
    {
        // samplers DCLs get handled in emit_METAL_sampler().

        if (flags & MOD_CENTROID)  // !!! FIXME
        {
            failf(ctx, "centroid unsupported in %s profile", ctx->profile->name);
            return;
        } // if

        if ((regtype == REG_TYPE_COLOROUT) || (regtype == REG_TYPE_DEPTHOUT))
        {
            push_output(ctx, &ctx->outputs);
            if (buffer_size(ctx->outputs) == 0)
            {
                output_line(ctx, "struct %s_Output", ctx->mainfn);
                output_line(ctx, "{");
            } // if
            ctx->indent++;

            if (regtype == REG_TYPE_COLOROUT)
                output_line(ctx, "float4 %s [[color(%d)]];", var, regnum);
            else if (regtype == REG_TYPE_DEPTHOUT)
                output_line(ctx, "float %s [[depth(any)]];", var);

            pop_output(ctx);

            push_output(ctx, &ctx->mainline_top);
            ctx->indent++;
            // !!! FIXME: this doesn't work.
            //output_line(ctx, "float%s &%s = output.%s;", (regtype == REG_TYPE_DEPTHOUT) ? "" : "4", var, var);
            output_line(ctx, "#define %s output.%s", var, var);
            pop_output(ctx);
            push_output(ctx, &ctx->mainline);
            ctx->indent++;
            output_line(ctx, "#undef %s", var);  // !!! FIXME: gross.
            pop_output(ctx);
        } // if

        // !!! FIXME: can you actualy have a texture register with COLOR usage?
        else if ((regtype == REG_TYPE_TEXTURE) ||
                 (regtype == REG_TYPE_INPUT) ||
                 (regtype == REG_TYPE_MISCTYPE))
        {
            int skipreference = 0;
            push_output(ctx, &ctx->inputs);
            if (buffer_size(ctx->inputs) == 0)
            {
                output_line(ctx, "struct %s_Input", ctx->mainfn);
                output_line(ctx, "{");
            } // if
            ctx->indent++;

            if (regtype == REG_TYPE_MISCTYPE)
            {
                const MiscTypeType mt = (MiscTypeType) regnum;
                if (mt == MISCTYPE_TYPE_FACE)
                    output_line(ctx, "bool %s [[front_facing]];", var);
                else if (mt == MISCTYPE_TYPE_POSITION)
                    output_line(ctx, "float4 %s [[position]];", var);
                else
                    fail(ctx, "BUG: unhandled misc register");
            } // else if

            else
            {
                if (usage == MOJOSHADER_USAGE_TEXCOORD)
                {
                    // ps_1_1 does a different hack for this attribute.
                    //  Refer to emit_METAL_global()'s REG_TYPE_ADDRESS code.
                    if (!shader_version_atleast(ctx, 1, 4))
                        skipreference = 1;
                    output_line(ctx, "float4 %s [[user(texcoord%d)]];", var, index);
                } // if

                else if (usage == MOJOSHADER_USAGE_COLOR)
                    output_line(ctx, "float4 %s [[user(color%d)]];", var, index);

                else if (usage == MOJOSHADER_USAGE_FOG)
                    output_line(ctx, "float4 %s [[user(fog)]];", var);
            } // else

            pop_output(ctx);

            // !!! FIXME: can cause unused var warnings in Clang...
            #if 0
            push_output(ctx, &ctx->mainline_top);
            ctx->indent++;
            if ((regtype == REG_TYPE_MISCTYPE)&&(regnum == MISCTYPE_TYPE_FACE))
                output_line(ctx, "constant bool &%s = input.%s;", var, var);
            else if (!skipreference)
                output_line(ctx, "constant float4 &%s = input.%s;", var, var);
            pop_output(ctx);
            #endif

            if (!skipreference)
            {
                push_output(ctx, &ctx->mainline_top);
                ctx->indent++;
                output_line(ctx, "#define %s input.%s", var, var);
                pop_output(ctx);
                push_output(ctx, &ctx->mainline);
                ctx->indent++;
                output_line(ctx, "#undef %s", var);  // !!! FIXME: gross.
                pop_output(ctx);
            } // if
        } // else if

        else
        {
            fail(ctx, "unknown pixel shader attribute register");
        } // else
    } // else if

    else
    {
        fail(ctx, "Unknown shader type");  // state machine should catch this.
    } // else
}